

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall
CppGenerator::generateCode(CppGenerator *this,bool hasApplicationHandler,bool hasDynamicFunctions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  element_type *peVar7;
  TDNode *node;
  size_t sVar8;
  ulong uVar9;
  size_t **ppsVar10;
  size_t *psVar11;
  CppGenerator *pCVar12;
  TDNode *pTVar13;
  size_type sVar14;
  string *psVar15;
  byte in_DL;
  byte in_SIL;
  CppGenerator *in_RDI;
  ulong uVar16;
  bool taskParallelism;
  size_t group;
  bool domainParallelism;
  size_t var_1;
  size_t orderIdx;
  size_t var;
  var_bitset nodeBag;
  size_t rel_1;
  size_t view;
  size_t rel;
  CppGenerator *in_stack_00000260;
  CppGenerator *in_stack_000003a0;
  size_t in_stack_000004a8;
  CppGenerator *in_stack_000004b0;
  undefined1 in_stack_0000066f;
  CppGenerator *in_stack_00000670;
  CppGenerator *in_stack_000007e0;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  TreeDecomposition *in_stack_fffffffffffffe70;
  bitset<100UL> *in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe88;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffec8;
  undefined1 paralleize_groups;
  CppGenerator *pCVar17;
  string *in_stack_ffffffffffffff00;
  ulong local_d0;
  reference local_c0;
  ulong local_b0;
  long local_a8;
  reference local_a0;
  ulong local_90;
  _WordT local_88;
  _WordT local_80;
  ulong local_78;
  string local_60 [32];
  string local_40 [32];
  CppGenerator *local_20;
  ulong local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  in_RDI->_hasApplicationHandler = (bool)local_9;
  in_RDI->_hasDynamicFunctions = (bool)local_a;
  peVar7 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x281b0e);
  node = (TDNode *)TreeDecomposition::numberOfRelations(peVar7);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x281b2f);
  sVar8 = QueryCompiler::numberOfViews((QueryCompiler *)0x281b37);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &(((TDNode *)(&node->_bag + -5))->_name)._M_dataplus + sVar8;
  uVar9 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  ppsVar10 = (size_t **)operator_new__(uVar9);
  in_RDI->sortOrders = ppsVar10;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x281b7e);
  sVar8 = QueryCompiler::numberOfViews((QueryCompiler *)0x281b86);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar8;
  uVar9 = SUB168(auVar2 * ZEXT816(0x20),0);
  uVar16 = uVar9 + 8;
  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar9) {
    uVar16 = 0xffffffffffffffff;
  }
  psVar11 = (size_t *)operator_new__(uVar16);
  *psVar11 = sVar8;
  psVar15 = (string *)(psVar11 + 1);
  if (sVar8 != 0) {
    in_stack_ffffffffffffff00 = psVar15;
    do {
      std::__cxx11::string::string((string *)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1;
    } while (in_stack_ffffffffffffff00 != psVar15 + sVar8);
  }
  in_RDI->viewName = psVar15;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x281c58);
  sVar8 = QueryCompiler::numberOfViews((QueryCompiler *)0x281c60);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar8;
  uVar9 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  psVar11 = (size_t *)operator_new__(uVar9);
  in_RDI->viewLevelRegister = psVar11;
  local_18 = 0;
  while( true ) {
    uVar9 = local_18;
    peVar7 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x281cc0);
    sVar8 = TreeDecomposition::numberOfRelations(peVar7);
    if (sVar8 <= uVar9) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x281ced);
    TreeDecomposition::getRelation
              (in_stack_fffffffffffffe70,
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    sVar8 = std::bitset<100UL>::count((bitset<100UL> *)0x281d09);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar8;
    uVar9 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    psVar11 = (size_t *)operator_new__(uVar9);
    memset(psVar11,0,uVar9);
    in_RDI->sortOrders[local_18] = psVar11;
    local_18 = local_18 + 1;
  }
  local_20 = (CppGenerator *)0x0;
  while( true ) {
    pCVar17 = local_20;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x281da6);
    pCVar12 = (CppGenerator *)QueryCompiler::numberOfViews((QueryCompiler *)0x281dae);
    if (pCVar12 <= pCVar17) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x281dd0);
    QueryCompiler::getView
              ((QueryCompiler *)in_stack_fffffffffffffe70,
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    sVar8 = std::bitset<100UL>::count((bitset<100UL> *)0x281dec);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = sVar8;
    uVar9 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    psVar11 = (size_t *)operator_new__(uVar9);
    memset(psVar11,0,uVar9);
    pCVar17 = local_20;
    ppsVar10 = in_RDI->sortOrders;
    peVar7 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x281e4a);
    sVar8 = TreeDecomposition::numberOfRelations(peVar7);
    ppsVar10[(long)&(pCVar17->super_CodeGenerator)._vptr_CodeGenerator + sVar8] = psVar11;
    in_stack_fffffffffffffec8 = local_60;
    std::__cxx11::to_string(uVar9);
    std::operator+((char *)in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
    std::__cxx11::string::operator=((string *)(in_RDI->viewName + (long)local_20),local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    local_20 = (CppGenerator *)((long)&(local_20->super_CodeGenerator)._vptr_CodeGenerator + 1);
  }
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_78 = 0;
  while( true ) {
    uVar9 = local_78;
    peVar7 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x281f67);
    sVar8 = TreeDecomposition::numberOfRelations(peVar7);
    if (sVar8 <= uVar9) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x281f91);
    pTVar13 = TreeDecomposition::getRelation
                        (in_stack_fffffffffffffe70,
                         CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    local_88 = (pTVar13->_bag).super__Base_bitset<2UL>._M_w[0];
    local_80 = (pTVar13->_bag).super__Base_bitset<2UL>._M_w[1];
    for (local_90 = 0; local_90 < 100; local_90 = local_90 + 1) {
      std::bitset<100UL>::operator[](in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
      bVar6 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffe70);
      std::bitset<100UL>::reference::~reference(&local_a0);
      if (bVar6) {
        std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                  (&in_RDI->variableDependency,local_90);
        std::bitset<100UL>::operator|=
                  ((bitset<100UL> *)in_stack_fffffffffffffe70,
                   (bitset<100UL> *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      }
    }
    local_78 = local_78 + 1;
  }
  local_a8 = 0;
  for (local_b0 = 0; paralleize_groups = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38),
      local_b0 < 100; local_b0 = local_b0 + 1) {
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2820b3);
    std::bitset<100UL>::operator[](in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
    bVar6 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffe70);
    std::bitset<100UL>::reference::~reference(&local_c0);
    if (bVar6) {
      ppsVar10 = in_RDI->sortOrders;
      uVar9 = local_b0;
      peVar7 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x282121);
      ppsVar10[peVar7->_root->_id][local_a8] = uVar9;
      local_a8 = local_a8 + 1;
    }
  }
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x282185);
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28219e);
  createRelationSortingOrder(in_RDI,node,(size_t *)in_stack_ffffffffffffff00);
  createGroupVariableOrder(in_stack_00000260);
  computeParallelizeGroup(pCVar17,(bool)paralleize_groups);
  genDataHandler(in_stack_000007e0);
  local_d0 = 0;
  while (uVar9 = local_d0,
        sVar14 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::size(&in_RDI->viewGroups), uVar9 < sVar14) {
    genComputeGroupFiles(in_stack_000004b0,in_stack_000004a8);
    local_d0 = local_d0 + 1;
  }
  genMainFunction(in_stack_00000670,(bool)in_stack_0000066f);
  genMakeFile(in_stack_000003a0);
  return;
}

Assistant:

void CppGenerator::generateCode(bool hasApplicationHandler,
                                bool hasDynamicFunctions)
{
    DINFO("Start generate C++ code. \n");

    _hasApplicationHandler = hasApplicationHandler;
    _hasDynamicFunctions = hasDynamicFunctions;
    
    sortOrders = new size_t*[_td->numberOfRelations() + _qc->numberOfViews()];
    viewName = new std::string[_qc->numberOfViews()];
    viewLevelRegister  = new size_t[_qc->numberOfViews()];
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        sortOrders[rel] = new size_t[_td->getRelation(rel)->_bag.count()]();
    
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {   
        sortOrders[view + _td->numberOfRelations()] =
            new size_t[_qc->getView(view)->_fVars.count()]();
        viewName[view] = "V"+std::to_string(view);
    }
    
    variableDependency.resize(NUM_OF_VARIABLES);
    
    // Find all the dependencies amongst the variables
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        var_bitset nodeBag = _td->getRelation(rel)->_bag;

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (nodeBag[var])
                variableDependency[var] |= nodeBag;
        }
    }
    
    // FIRST WE CREATE THE VARIABLE ORDER FOR EACH RELATION
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_td->_root->_bag[var])
        {
            sortOrders[_td->_root->_id][orderIdx] = var;
            ++orderIdx;
        }
    }
    
    createRelationSortingOrder(_td->_root, _td->_root->_id);
    
    createGroupVariableOrder();

    bool domainParallelism = PARALLEL_TYPE == DOMAIN_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    computeParallelizeGroup(domainParallelism);
    
    genDataHandler();
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
        genComputeGroupFiles(group);
    
    bool taskParallelism = PARALLEL_TYPE == TASK_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    genMainFunction(taskParallelism);
    
    genMakeFile();    
}